

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t val;
  long lVar3;
  uint uVar4;
  uint uVar5;
  target_ulong base;
  uint uVar6;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  
  uVar6 = env->hflags & 3;
  uVar4 = selector & 0xfffc;
  if (uVar4 == 0) {
    if ((seg_reg == 2) && ((-1 < (short)env->hflags || (uVar6 == 3)))) {
      raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
    }
    base = 0;
    val = 0;
    uVar4 = 0;
    goto LAB_004d7606;
  }
  lVar3 = 0x148;
  if ((selector & 4U) == 0) {
    lVar3 = 0x178;
  }
  uVar5 = selector & 0xfff8;
  if (*(uint *)((long)env->regs + lVar3 + 0x10) < uVar5 + 7) {
    raise_exception_err_ra_x86_64(env,0xd,uVar4,unaff_retaddr);
  }
  lVar3 = *(long *)((long)env->regs + lVar3 + 8);
  iVar1 = cpu_mmu_index_kernel(env);
  uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,(ulong)uVar5 + lVar3,iVar1,unaff_retaddr);
  addr = lVar3 + (ulong)uVar5 + 4;
  iVar1 = cpu_mmu_index_kernel(env);
  val = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar1,unaff_retaddr);
  if ((val >> 0xc & 1) != 0) {
    uVar5 = val >> 0xd & 3;
    if (seg_reg == 2) {
      if ((((val & 0xa00) == 0x200) && ((selector & 3U) == uVar6)) && (uVar5 == uVar6)) {
        if (-1 < (short)val) {
          iVar1 = 0xc;
          goto LAB_004d761b;
        }
LAB_004d758e:
        if ((val >> 8 & 1) == 0) {
          val = val | 0x100;
          iVar1 = cpu_mmu_index_kernel(env);
          cpu_stl_mmuidx_ra_x86_64(env,addr,val,iVar1,unaff_retaddr);
        }
        base = (target_ulong)(val & 0xff000000 | uVar2 >> 0x10 | (val & 0xff) << 0x10);
        uVar6 = val & 0xf0000 | uVar2 & 0xffff;
        uVar4 = uVar6 << 0xc | 0xfff;
        if ((val >> 0x17 & 1) == 0) {
          uVar4 = uVar6;
        }
LAB_004d7606:
        cpu_x86_load_seg_cache(env,seg_reg,selector & 0xffff,base,uVar4,val);
        return;
      }
    }
    else if (((val & 0xa00) != 0x800) &&
            (((~val & 0xc00) == 0 || ((uVar6 <= uVar5 && ((selector & 3U) <= uVar5)))))) {
      if (-1 < (short)val) {
        iVar1 = 0xb;
        goto LAB_004d761b;
      }
      goto LAB_004d758e;
    }
  }
  iVar1 = 0xd;
LAB_004d761b:
  raise_exception_err_ra_x86_64(env,iVar1,uVar4,unaff_retaddr);
}

Assistant:

void helper_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    uint32_t e1, e2;
    int cpl, dpl, rpl;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    selector &= 0xffff;
    cpl = env->hflags & HF_CPL_MASK;
    if ((selector & 0xfffc) == 0) {
        /* null selector case */
        if (seg_reg == R_SS
#ifdef TARGET_X86_64
            && (!(env->hflags & HF_CS64_MASK) || cpl == 3)
#endif
            ) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector, 0, 0, 0);
    } else {

        if (selector & 0x4) {
            dt = &env->ldt;
        } else {
            dt = &env->gdt;
        }
        index = selector & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());

        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_SS) {
            /* must be writable segment */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            if (rpl != cpl || dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
        } else {
            /* must be readable segment */
            if ((e2 & (DESC_CS_MASK | DESC_R_MASK)) == DESC_CS_MASK) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }

            if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
                /* if not conforming code, test rights */
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
                }
            }
        }

        if (!(e2 & DESC_P_MASK)) {
            if (seg_reg == R_SS) {
                raise_exception_err_ra(env, EXCP0C_STACK, selector & 0xfffc, GETPC());
            } else {
                raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
            }
        }

        /* set the access bit if not already set */
        if (!(e2 & DESC_A_MASK)) {
            e2 |= DESC_A_MASK;
            cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
        }

        cpu_x86_load_seg_cache(env, seg_reg, selector,
                       get_seg_base(e1, e2),
                       get_seg_limit(e1, e2),
                       e2);
#if 0
        qemu_log("load_seg: sel=0x%04x base=0x%08lx limit=0x%08lx flags=%08x\n",
                selector, (unsigned long)sc->base, sc->limit, sc->flags);
#endif
    }
}